

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# packet_encoding.cpp
# Opt level: O3

void ximu::PacketEncoding::leftShiftBytes(vector<unsigned_char,_std::allocator<unsigned_char>_> *v)

{
  pointer puVar1;
  byte *pbVar2;
  byte *pbVar3;
  
  puVar1 = (v->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
           super__Vector_impl_data._M_start;
  *puVar1 = *puVar1 << 1;
  pbVar3 = (v->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
           super__Vector_impl_data._M_start;
  while (pbVar2 = pbVar3 + 1,
        pbVar2 != (v->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
                  super__Vector_impl_data._M_finish) {
    if ((char)*pbVar2 < '\0') {
      *pbVar3 = *pbVar3 | 1;
    }
    *pbVar2 = *pbVar2 * '\x02';
    pbVar3 = pbVar2;
  }
  return;
}

Assistant:

void PacketEncoding::leftShiftBytes(std::vector<unsigned char>& v) {
  v.front() <<= 1;

  for (auto byteIt = v.begin() + 1; byteIt != v.end(); ++byteIt) {
    if ((*byteIt & 0x80) == 0x80)
      *(byteIt - 1) |= 0x01;
    *byteIt <<= 1;
  }
}